

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Maybe<kj::OwnFd> __thiscall
kj::anon_unknown_9::DiskHandle::tryOpenFileInternal
          (DiskHandle *this,PathPtr path,WriteMode mode,bool append)

{
  uint __oflag;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int code;
  undefined4 in_register_0000000c;
  char *__file;
  char in_R9B;
  PathPtr path_00;
  PathPtr path_01;
  char local_68;
  Fault f;
  PathPtr path_local;
  String filename;
  
  path_local.parts.size_ = CONCAT44(in_register_0000000c,mode);
  path_local.parts.ptr = (String *)path.parts.size_;
  path_01.parts.ptr = path.parts.ptr;
  if (append) {
    local_68 = (char)((append & 2) >> 1);
    uVar2 = (uint)((append & 2U) == 0) << 7 | 0x80042;
  }
  else {
    if ((append & 2U) == 0) {
      *(undefined1 *)&(this->fd).fd = 0;
      return (Maybe<kj::OwnFd>)(NullableValue<kj::OwnFd>)this;
    }
    uVar2 = 0x80002;
    local_68 = '\x01';
  }
  __oflag = uVar2 | 0x400;
  if (in_R9B == '\0') {
    __oflag = uVar2;
  }
  PathPtr::toString(&filename,&path_local,false);
  do {
    __file = "";
    if (filename.content.size_ != 0) {
      __file = filename.content.ptr;
    }
    iVar3 = openat64(*(int *)&((path_01.parts.ptr)->content).ptr,__file,__oflag);
    if (-1 < iVar3) goto LAB_001e1740;
    code = _::Debug::getOsErrorNumber(false);
  } while (code == -1);
  if (code == 0) {
LAB_001e1740:
    *(undefined1 *)&(this->fd).fd = 1;
    this[1].fd.fd = iVar3;
    f.exception._0_4_ = 0xffffffff;
    OwnFd::~OwnFd((OwnFd *)&f);
    goto LAB_001e184b;
  }
  if (code == 2) {
    if (append) {
      if (((append & 4U) != 0) && (path_local.parts.size_ != 0)) {
        path_00 = PathPtr::parent(&path_local);
        bVar1 = tryMkdir((DiskHandle *)path_01.parts.ptr,path_00,CREATE_PARENT|MODIFY|CREATE,true);
        if (bVar1) {
          path_01.parts.size_ = (size_t)path_local.parts.ptr;
          tryOpenFileInternal(this,path_01,(WriteMode)path_local.parts.size_,(bool)(append & 0xfb));
          goto LAB_001e184b;
        }
      }
      if (local_68 == '\0') {
        if (filename.content.size_ == 0) {
          filename.content.ptr = "";
        }
        iVar3 = faccessat(*(int *)&((path_01.parts.ptr)->content).ptr,filename.content.ptr,0,0x100);
        if (-1 < iVar3) goto LAB_001e1843;
      }
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x413,FAILED,(char *)0x0,"\"parent is not a directory\", path",
                 (char (*) [26])"parent is not a directory",&path_local);
      *(undefined1 *)&(this->fd).fd = 0;
      _::Debug::Fault::~Fault(&f);
      goto LAB_001e184b;
    }
  }
  else if (code == 0x11) {
    if (local_68 != '\0') goto LAB_001e17cd;
  }
  else if ((code != 0x14) || (append)) {
LAB_001e17cd:
    _::Debug::Fault::Fault<int,kj::PathPtr&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x426,code,"openat(fd, path, O_RDWR | ...)","path",&path_local);
    *(undefined1 *)&(this->fd).fd = 0;
    _::Debug::Fault::~Fault(&f);
    goto LAB_001e184b;
  }
LAB_001e1843:
  *(undefined1 *)&(this->fd).fd = 0;
LAB_001e184b:
  Array<char>::~Array(&filename.content);
  return (Maybe<kj::OwnFd>)(NullableValue<kj::OwnFd>)this;
}

Assistant:

Maybe<OwnFd> tryOpenFileInternal(PathPtr path, WriteMode mode, bool append) const {
    uint flags = O_RDWR | MAYBE_O_CLOEXEC;
    mode_t acl = 0666;
    if (has(mode, WriteMode::CREATE)) {
      flags |= O_CREAT;
    }
    if (!has(mode, WriteMode::MODIFY)) {
      if (!has(mode, WriteMode::CREATE)) {
        // Neither CREATE nor MODIFY -- impossible to satisfy preconditions.
        return kj::none;
      }
      flags |= O_EXCL;
    }
    if (append) {
      flags |= O_APPEND;
    }
    if (has(mode, WriteMode::EXECUTABLE)) {
      acl = 0777;
    }
    if (has(mode, WriteMode::PRIVATE)) {
      acl &= 0700;
    }

    auto filename = path.toString();

    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(fd, filename.cStr(), flags, acl)) {
      case ENOENT:
        if (has(mode, WriteMode::CREATE)) {
          // Either:
          // - The file is a broken symlink.
          // - A parent directory didn't exist.
          if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
              tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                      WriteMode::CREATE_PARENT, true)) {
            // Retry, but make sure we don't try to create the parent again.
            return tryOpenFileInternal(path, mode - WriteMode::CREATE_PARENT, append);
          }

          // Check for broken link.
          if (!has(mode, WriteMode::MODIFY) &&
              faccessat(fd, filename.cStr(), F_OK, AT_SYMLINK_NOFOLLOW) >= 0) {
            // Yep. We treat this as already-exists, which means in CREATE-only mode this is a
            // simple failure.
            return kj::none;
          }

          KJ_FAIL_REQUIRE("parent is not a directory", path) { return kj::none; }
        } else {
          // MODIFY-only mode. ENOENT = doesn't exist = return null.
          return kj::none;
        }
      case ENOTDIR:
        if (!has(mode, WriteMode::CREATE)) {
          // MODIFY-only mode. ENOTDIR = parent not a directory = doesn't exist = return null.
          return kj::none;
        }
        goto failed;
      case EEXIST:
        if (!has(mode, WriteMode::MODIFY)) {
          // CREATE-only mode. EEXIST = already exists = return null.
          return kj::none;
        }
        goto failed;
      default:
      failed:
        KJ_FAIL_SYSCALL("openat(fd, path, O_RDWR | ...)", error, path) { return kj::none; }
    }

    kj::OwnFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return kj::mv(result);
  }